

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.h
# Opt level: O0

void __thiscall vp9_parser::Vp9HeaderParser::Vp9HeaderParser(Vp9HeaderParser *this)

{
  Vp9HeaderParser *this_local;
  
  this->frame_ = (uint8_t *)0x0;
  this->frame_size_ = 0;
  this->bit_offset_ = 0;
  this->profile_ = -1;
  this->show_existing_frame_ = 0;
  this->key_ = 0;
  this->altref_ = 0;
  this->error_resilient_mode_ = 0;
  this->intra_only_ = 0;
  this->reset_frame_context_ = 0;
  this->bit_depth_ = 0;
  this->color_space_ = 0;
  this->color_range_ = 0;
  this->subsampling_x_ = 0;
  this->subsampling_y_ = 0;
  this->refresh_frame_flags_ = 0;
  this->width_ = 0;
  this->height_ = 0;
  this->row_tiles_ = 0;
  this->column_tiles_ = 0;
  this->frame_parallel_mode_ = 0;
  return;
}

Assistant:

Vp9HeaderParser()
      : frame_(NULL),
        frame_size_(0),
        bit_offset_(0),
        profile_(-1),
        show_existing_frame_(0),
        key_(0),
        altref_(0),
        error_resilient_mode_(0),
        intra_only_(0),
        reset_frame_context_(0),
        bit_depth_(0),
        color_space_(0),
        color_range_(0),
        subsampling_x_(0),
        subsampling_y_(0),
        refresh_frame_flags_(0),
        width_(0),
        height_(0),
        row_tiles_(0),
        column_tiles_(0),
        frame_parallel_mode_(0) {}